

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::ScaleParameter::ByteSizeLong(ScaleParameter *this)

{
  uint uVar1;
  UnknownFieldSet *unknown_fields;
  size_t sVar2;
  size_t sVar3;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar3 = 0;
  }
  else {
    unknown_fields = ScaleParameter::unknown_fields(this);
    sVar3 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<caffe::FillerParameter>(this->filler_);
      sVar3 = sVar3 + sVar2 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<caffe::FillerParameter>(this->bias_filler_);
      sVar3 = sVar3 + sVar2 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    sVar3 = (uVar1 >> 1 & 2) + sVar3;
    if ((uVar1 & 8) != 0) {
      sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->axis_);
      sVar3 = sVar3 + sVar2 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x10) != 0) {
      sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->num_axes_);
      sVar3 = sVar3 + sVar2 + 1;
    }
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t ScaleParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.ScaleParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 31u) {
    // optional .caffe.FillerParameter filler = 3;
    if (has_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->filler_);
    }

    // optional .caffe.FillerParameter bias_filler = 5;
    if (has_bias_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->bias_filler_);
    }

    // optional bool bias_term = 4 [default = false];
    if (has_bias_term()) {
      total_size += 1 + 1;
    }

    // optional int32 axis = 1 [default = 1];
    if (has_axis()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->axis());
    }

    // optional int32 num_axes = 2 [default = 1];
    if (has_num_axes()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->num_axes());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}